

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O2

void alGetSourcef(ALuint name,ALenum param,ALfloat *value)

{
  ALfloat x;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetSourcef);
  writele32(name);
  writele32(param);
  IO_UINT64((uint64)value);
  (*REAL_alGetSourcef)(name,param,value);
  if (value == (ALfloat *)0x0) {
    x = 0.0;
  }
  else {
    x = *value;
  }
  writele32((uint32)x);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetSourcef(ALuint name, ALenum param, ALfloat *value)
{
    IO_START(alGetSourcef);
    IO_UINT32(name);
    IO_ENUM(param);
    IO_PTR(value);
    REAL_alGetSourcef(name, param, value);
    IO_FLOAT(value ? *value : 0.0f);
    IO_END();
}